

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

int Gia_ManFindChains_rec
              (Gia_Man_t *p,int iMaj,Vec_Int_t *vFadds,Vec_Int_t *vMap,Vec_Int_t *vLength)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Gia_Obj_t *pObj;
  int *piVar6;
  int local_6c;
  int local_68;
  int local_64;
  int t_1;
  int t;
  int iLen;
  int iLen2;
  int iLen1;
  int iLen0;
  int iXor2;
  int iXor1;
  int iXor0;
  int iFadd;
  Vec_Int_t *vLength_local;
  Vec_Int_t *vMap_local;
  Vec_Int_t *vFadds_local;
  int iMaj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntEntry(vMap,iMaj);
  if (iVar1 < 0) {
    __assert_fail("Vec_IntEntry(vMap, iMaj) >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                  ,0x1b4,
                  "int Gia_ManFindChains_rec(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  iVar1 = Vec_IntEntry(vLength,iMaj);
  if (iVar1 < 0) {
    pObj = Gia_ManObj(p,iMaj);
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(Gia_ManObj(p, iMaj))",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                    ,0x1b7,
                    "int Gia_ManFindChains_rec(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    iVar1 = Vec_IntEntry(vMap,iMaj);
    iVar2 = Vec_IntEntry(vFadds,iVar1 * 5);
    iVar3 = Vec_IntEntry(vFadds,iVar1 * 5 + 1);
    iVar4 = Vec_IntEntry(vFadds,iVar1 * 5 + 2);
    iVar5 = Vec_IntEntry(vMap,iVar2);
    if (iVar5 == -1) {
      local_64 = 0;
    }
    else {
      local_64 = Gia_ManFindChains_rec(p,iVar2,vFadds,vMap,vLength);
    }
    iVar2 = Vec_IntEntry(vMap,iVar3);
    if (iVar2 == -1) {
      local_68 = 0;
    }
    else {
      local_68 = Gia_ManFindChains_rec(p,iVar3,vFadds,vMap,vLength);
    }
    iVar2 = Vec_IntEntry(vMap,iVar4);
    if (iVar2 == -1) {
      local_6c = 0;
    }
    else {
      local_6c = Gia_ManFindChains_rec(p,iVar4,vFadds,vMap,vLength);
    }
    iVar2 = Abc_MaxInt(local_68,local_6c);
    iVar2 = Abc_MaxInt(local_64,iVar2);
    if (local_64 < iVar2) {
      if (iVar2 == local_68) {
        piVar6 = Vec_IntArray(vFadds);
        iVar3 = piVar6[iVar1 * 5];
        piVar6 = Vec_IntArray(vFadds);
        iVar4 = piVar6[iVar1 * 5 + 1];
        piVar6 = Vec_IntArray(vFadds);
        piVar6[iVar1 * 5] = iVar4;
        piVar6 = Vec_IntArray(vFadds);
        piVar6[iVar1 * 5 + 1] = iVar3;
      }
      else if (iVar2 == local_6c) {
        piVar6 = Vec_IntArray(vFadds);
        iVar3 = piVar6[iVar1 * 5];
        piVar6 = Vec_IntArray(vFadds);
        iVar4 = piVar6[iVar1 * 5 + 2];
        piVar6 = Vec_IntArray(vFadds);
        piVar6[iVar1 * 5] = iVar4;
        piVar6 = Vec_IntArray(vFadds);
        piVar6[iVar1 * 5 + 2] = iVar3;
      }
    }
    Vec_IntWriteEntry(vLength,iMaj,iVar2 + 1);
    p_local._4_4_ = iVar2 + 1;
  }
  else {
    p_local._4_4_ = Vec_IntEntry(vLength,iMaj);
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManFindChains_rec( Gia_Man_t * p, int iMaj, Vec_Int_t * vFadds, Vec_Int_t * vMap, Vec_Int_t * vLength )
{
    assert( Vec_IntEntry(vMap, iMaj) >= 0 ); // MAJ
    if ( Vec_IntEntry(vLength, iMaj) >= 0 )
        return Vec_IntEntry(vLength, iMaj);
    assert( Gia_ObjIsAnd(Gia_ManObj(p, iMaj)) );
    {
        int iFadd = Vec_IntEntry( vMap, iMaj );
        int iXor0 = Vec_IntEntry( vFadds, 5*iFadd+0 );
        int iXor1 = Vec_IntEntry( vFadds, 5*iFadd+1 );
        int iXor2 = Vec_IntEntry( vFadds, 5*iFadd+2 );
        int iLen0 = Vec_IntEntry( vMap, iXor0 ) == -1 ? 0 : Gia_ManFindChains_rec( p, iXor0, vFadds, vMap, vLength );
        int iLen1 = Vec_IntEntry( vMap, iXor1 ) == -1 ? 0 : Gia_ManFindChains_rec( p, iXor1, vFadds, vMap, vLength );
        int iLen2 = Vec_IntEntry( vMap, iXor2 ) == -1 ? 0 : Gia_ManFindChains_rec( p, iXor2, vFadds, vMap, vLength );
        int iLen = Abc_MaxInt( iLen0, Abc_MaxInt(iLen1, iLen2) );
        if ( iLen0 < iLen )
        {
            if ( iLen == iLen1 )
            {
                ABC_SWAP( int, Vec_IntArray(vFadds)[5*iFadd+0], Vec_IntArray(vFadds)[5*iFadd+1] );
            }
            else if ( iLen == iLen2 )
            {
                ABC_SWAP( int, Vec_IntArray(vFadds)[5*iFadd+0], Vec_IntArray(vFadds)[5*iFadd+2] );
            }
        }
        Vec_IntWriteEntry( vLength, iMaj, iLen + 1 );
        return iLen + 1;
    }
}